

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool __thiscall
Lodtalk::MethodSemanticAnalysis::optimizeMessage
          (MethodSemanticAnalysis *this,MessageSendNode *node,CompilerOptimizedSelector selectorId)

{
  Node *node_00;
  value_type pNVar1;
  Node *pNVar2;
  value_type pNVar3;
  pointer ppNVar4;
  byte bVar5;
  uint uVar6;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  reference ppNVar7;
  value_type bodyBlock_2;
  value_type stepValue;
  value_type stopValue_1;
  Node *startValue_1;
  value_type bodyBlock_1;
  value_type stopValue;
  Node *startValue;
  value_type bodyBlock;
  Node *conditionBlock;
  value_type elseBlock;
  value_type thenBlock_1;
  value_type thenBlock;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  Node *receiver;
  CompilerOptimizedSelector selectorId_local;
  MessageSendNode *node_local;
  MethodSemanticAnalysis *this_local;
  
  arguments.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AST::MessageSendNode::getReceiver(node);
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector
            ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)&thenBlock,__x);
  ppNVar4 = arguments.
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  switch(selectorId) {
  case IfTrue:
  case IfFalse:
  case IfNil:
  case IfNotNil:
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,0);
    pNVar2 = *ppNVar7;
    (*(code *)(*arguments.
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)[2]._vptr_Node)
              (arguments.
               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,this);
    inlineBlock(this,pNVar2,0);
    break;
  case IfTrueIfFalse:
  case IfFalseIfTrue:
  case IfNilIfNotNil:
  case IfNotNilIfNil:
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,0);
    pNVar2 = *ppNVar7;
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,1);
    node_00 = *ppNVar7;
    (*(code *)(*arguments.
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)[2]._vptr_Node)
              (arguments.
               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,this);
    inlineBlock(this,pNVar2,0);
    inlineBlock(this,node_00,0);
    break;
  case WhileTrue:
  case WhileFalse:
    bVar5 = (*(code *)(*arguments.
                        super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)[5]._vptr_Node)();
    ppNVar4 = arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((bVar5 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a4ccd;
    }
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,0);
    pNVar2 = *ppNVar7;
    inlineBlock(this,(Node *)ppNVar4,0);
    inlineBlock(this,pNVar2,0);
    break;
  default:
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "bool Lodtalk::MethodSemanticAnalysis::optimizeMessage(MessageSendNode *, CompilerOptimizedSelector)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x38c);
    abort();
  case ToByDo:
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,0);
    pNVar1 = *ppNVar7;
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,1);
    pNVar3 = *ppNVar7;
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,2);
    pNVar2 = *ppNVar7;
    uVar6 = (*pNVar2->_vptr_Node[5])();
    if ((uVar6 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a4ccd;
    }
    (*(code *)(*ppNVar4)[2]._vptr_Node)(ppNVar4,this);
    (*pNVar1->_vptr_Node[2])(pNVar1,this);
    (*pNVar3->_vptr_Node[2])(pNVar3,this);
    inlineBlock(this,pNVar2,1);
    break;
  case ToDo:
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,0);
    pNVar1 = *ppNVar7;
    ppNVar7 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &thenBlock,1);
    pNVar2 = *ppNVar7;
    uVar6 = (*pNVar2->_vptr_Node[5])();
    if ((uVar6 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a4ccd;
    }
    (*(code *)(*ppNVar4)[2]._vptr_Node)(ppNVar4,this);
    (*pNVar1->_vptr_Node[2])(pNVar1,this);
    inlineBlock(this,pNVar2,1);
  }
  this_local._7_1_ = true;
LAB_001a4ccd:
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~vector
            ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)&thenBlock);
  return this_local._7_1_;
}

Assistant:

bool MethodSemanticAnalysis::optimizeMessage(MessageSendNode *node, CompilerOptimizedSelector selectorId)
{
    auto receiver = node->getReceiver();
    auto arguments = node->getArguments();

    switch(selectorId)
    {
    case CompilerOptimizedSelector::IfTrue:
    case CompilerOptimizedSelector::IfFalse:
    case CompilerOptimizedSelector::IfNil:
    case CompilerOptimizedSelector::IfNotNil:
        {
            auto thenBlock = arguments[0];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
    case CompilerOptimizedSelector::IfFalseIfTrue:
    case CompilerOptimizedSelector::IfNotNilIfNil:
    case CompilerOptimizedSelector::IfNilIfNotNil:

        {
            auto thenBlock = arguments[0];
            auto elseBlock = arguments[1];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
            inlineBlock(elseBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::WhileTrue:
    case CompilerOptimizedSelector::WhileFalse:
        {
            if(!receiver->isBlockExpression())
                return false;
            auto conditionBlock = receiver;
            auto bodyBlock = arguments[0];
            inlineBlock(conditionBlock, 0);
            inlineBlock(bodyBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::ToDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto bodyBlock = arguments[1];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    case CompilerOptimizedSelector::ToByDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto stepValue = arguments[1];
            auto bodyBlock = arguments[2];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            stepValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}